

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

BuilderFor<DynamicCapability> *
capnp::DynamicValue::Builder::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
          (BuilderFor<DynamicCapability> *__return_storage_ptr__,Builder *builder)

{
  if (builder->type == CAPABILITY) {
    (*(code *)(((builder->field_1).structValue.builder.segment)->super_SegmentReader).arena[4].
              _vptr_Arena)(__return_storage_ptr__);
    (__return_storage_ptr__->schema).super_Schema.raw =
         (RawBrandedSchema *)(builder->field_1).textValue.content.size_;
  }
  else {
    AsImpl<capnp::DynamicCapability,(capnp::Kind)7>::apply(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BuilderFor<DynamicCapability> DynamicValue::Builder::AsImpl<DynamicCapability>::apply(
    Builder& builder) {
  KJ_REQUIRE(builder.type == CAPABILITY, "Value type mismatch.") {
    return DynamicCapability::Client();
  }
  return builder.capabilityValue;
}